

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Decrement_Numeric(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var aRight_00;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    aRight_local = JavascriptBigInt::Decrement(aRight);
  }
  else {
    aRight_00 = TaggedInt::ToVarUnchecked(1);
    aRight_local = Subtract(aRight,aRight_00,scriptContext);
  }
  return aRight_local;
}

Assistant:

Var JavascriptMath::Decrement_Numeric(Var aRight, ScriptContext* scriptContext)
        {
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Decrement(aRight);
            }
            return JavascriptMath::Subtract(aRight, TaggedInt::ToVarUnchecked(1), scriptContext);
        }